

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

DynamicSize * slang::ast::dynamicBitstreamSize(Type *type,BitstreamSizeMode mode)

{
  ulong uVar1;
  uint64_t uVar2;
  BitstreamSizeMode mode_00;
  bool bVar3;
  bitwidth_t bVar4;
  uint uVar5;
  unsigned_long *puVar6;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> this;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> field_00;
  int in_EDX;
  Type *in_RDI;
  optional<unsigned_long> oVar7;
  ClassPropertySymbol *prop;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> __end5;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> __begin5;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  *__range5;
  ClassType *ct_1;
  FieldSymbol *field;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *__range4;
  UnpackedStructType *us;
  optional<unsigned_long> fixed;
  optional<unsigned_long> mul;
  bitwidth_t rw;
  Type *ct;
  DynamicSize elemSize;
  anon_class_24_3_5278a87e handleField;
  uint64_t fixedSize;
  uint64_t multiplier;
  Type *this_00;
  Type *in_stack_ffffffffffffff18;
  ValueSymbol *in_stack_ffffffffffffff20;
  anon_class_24_3_5278a87e *in_stack_ffffffffffffff28;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> in_stack_ffffffffffffff30;
  __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
  local_a0;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *local_98;
  UnpackedStructType *local_90;
  __unspec local_84;
  type_conflict local_83;
  __unspec local_82;
  type_conflict local_81;
  _Storage<unsigned_long,_true> local_80;
  undefined1 local_78;
  _Storage<unsigned_long,_true> local_70;
  undefined1 local_68;
  bitwidth_t local_5c;
  Type *local_58;
  undefined1 local_50 [24];
  undefined1 *local_38;
  undefined1 *local_30;
  ulong *local_28;
  ulong local_20;
  undefined1 local_18 [4];
  undefined4 in_stack_fffffffffffffff0;
  
  _local_18 = 0;
  this_00 = in_RDI;
  bVar4 = Type::getBitWidth(in_stack_ffffffffffffff18);
  local_20 = (ulong)bVar4;
  if (local_20 != 0) {
    DynamicSize::DynamicSize((DynamicSize *)in_RDI,0,local_20);
    return (DynamicSize *)this_00;
  }
  bVar3 = Type::isString((Type *)0x5eed44);
  if (bVar3) {
    uVar5 = 8;
    if (in_EDX == 1) {
      uVar5 = 0;
    }
    DynamicSize::DynamicSize((DynamicSize *)in_RDI,(ulong)uVar5,0);
    return (DynamicSize *)this_00;
  }
  local_38 = &stack0xfffffffffffffff4;
  local_30 = local_18;
  local_28 = &local_20;
  bVar3 = Type::isUnpackedArray(in_RDI);
  if (bVar3) {
    Type::getArrayElementType(in_stack_ffffffffffffff18);
    uVar2 = _local_18;
    uVar1 = _local_18 >> 0x20;
    mode_00 = (BitstreamSizeMode)uVar1;
    _local_18 = uVar2;
    dynamicBitstreamSize((Type *)CONCAT44(in_EDX,in_stack_fffffffffffffff0),mode_00);
    bVar3 = DynamicSize::operator_cast_to_bool((DynamicSize *)local_50);
    if (!bVar3) {
      *(undefined8 *)&in_RDI->super_Symbol = local_50._0_8_;
      (in_RDI->super_Symbol).name._M_len = local_50._8_8_;
      (in_RDI->super_Symbol).name._M_str = (char *)local_50._16_8_;
      return (DynamicSize *)this_00;
    }
    local_58 = Type::getCanonicalType(this_00);
    if ((local_58->super_Symbol).kind == FixedSizeUnpackedArrayType) {
      Symbol::as<slang::ast::FixedSizeUnpackedArrayType>((Symbol *)0x5eee4e);
      local_5c = ConstantRange::width((ConstantRange *)0x5eee5a);
      oVar7 = checkedMulU64((uint64_t)in_stack_ffffffffffffff20,(uint64_t)in_stack_ffffffffffffff18)
      ;
      local_70._M_value =
           oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      local_68 = oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_engaged;
      oVar7 = checkedMulU64((uint64_t)in_stack_ffffffffffffff20,(uint64_t)in_stack_ffffffffffffff18)
      ;
      local_80._M_value =
           oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      local_78 = oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_engaged;
      bVar3 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x5eeeb5);
      if ((bVar3) &&
         (bVar3 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x5eeec5), bVar3))
      {
        local_81 = (type_conflict)
                   std::operator<=><unsigned_long,_unsigned_long>
                             ((optional<unsigned_long> *)in_stack_ffffffffffffff28,
                              (unsigned_long *)in_stack_ffffffffffffff20);
        std::__cmp_cat::__unspec::__unspec(&local_82,(__unspec *)0x0);
        bVar3 = std::operator>(local_81);
        if (!bVar3) {
          local_83 = (type_conflict)
                     std::operator<=><unsigned_long,_unsigned_long>
                               ((optional<unsigned_long> *)in_stack_ffffffffffffff28,
                                (unsigned_long *)in_stack_ffffffffffffff20);
          std::__cmp_cat::__unspec::__unspec(&local_84,(__unspec *)0x0);
          bVar3 = std::operator>(local_83);
          if (!bVar3) {
            puVar6 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x5eef5d);
            _local_18 = *puVar6;
            puVar6 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x5eef72);
            local_20 = *puVar6;
            goto LAB_005ef1a3;
          }
        }
      }
      memset(in_RDI,0,0x18);
      DynamicSize::DynamicSize((DynamicSize *)in_RDI);
      return (DynamicSize *)this_00;
    }
    if (in_EDX == 2) {
      if (local_50._0_8_ == 0) {
        _local_18 = local_50._8_8_;
      }
      else {
        _local_18 = local_50._0_8_;
        local_20 = local_50._8_8_;
      }
    }
    else if (in_EDX == 0) {
      _local_18 = std::gcd<unsigned_long,unsigned_long>
                            ((unsigned_long)in_stack_ffffffffffffff30.current,
                             (unsigned_long)in_stack_ffffffffffffff28);
    }
  }
  else {
    bVar3 = Type::isUnpackedStruct((Type *)0x5ef005);
    if (bVar3) {
      Type::getCanonicalType(this_00);
      local_90 = Symbol::as<slang::ast::UnpackedStructType>((Symbol *)0x5ef023);
      local_98 = &local_90->fields;
      local_a0._M_current =
           (FieldSymbol **)
           std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)in_RDI);
      std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::end
                ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
                 in_stack_ffffffffffffff18);
      while (bVar3 = __gnu_cxx::
                     operator==<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                               ((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                                 *)this_00,
                                (__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                                 *)in_RDI), ((bVar3 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
        ::operator*(&local_a0);
        bVar3 = dynamicBitstreamSize::anon_class_24_3_5278a87e::operator()
                          (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        if (!bVar3) {
          memset(in_RDI,0,0x18);
          DynamicSize::DynamicSize((DynamicSize *)in_RDI);
          return (DynamicSize *)this_00;
        }
        __gnu_cxx::
        __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
        ::operator++(&local_a0);
      }
    }
    else {
      bVar3 = Type::isClass((Type *)0x5ef0d3);
      if (bVar3) {
        Type::getCanonicalType(this_00);
        Symbol::as<slang::ast::ClassType>((Symbol *)0x5ef0f1);
        Scope::membersOfType<slang::ast::ClassPropertySymbol>((Scope *)in_stack_ffffffffffffff20);
        this = std::ranges::
               subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
               ::begin((subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
                        *)&stack0xffffffffffffff30);
        field_00 = std::ranges::
                   subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
                   ::end((subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
                          *)&stack0xffffffffffffff30);
        while (bVar3 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
                                 ((self_type *)this_00,
                                  (specific_symbol_iterator<slang::ast::ClassPropertySymbol> *)
                                  in_RDI), ((bVar3 ^ 0xffU) & 1) != 0) {
          iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
          ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
                       *)0x5ef159);
          bVar3 = dynamicBitstreamSize::anon_class_24_3_5278a87e::operator()
                            ((anon_class_24_3_5278a87e *)this.current,
                             (ValueSymbol *)field_00.current);
          if (!bVar3) {
            memset(in_RDI,0,0x18);
            DynamicSize::DynamicSize((DynamicSize *)in_RDI);
            return (DynamicSize *)this_00;
          }
          iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
          ::
          operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
                    ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
                      *)this_00);
        }
      }
    }
  }
LAB_005ef1a3:
  DynamicSize::DynamicSize((DynamicSize *)in_RDI,_local_18,local_20);
  return (DynamicSize *)this_00;
}

Assistant:

static DynamicSize dynamicBitstreamSize(const Type& type, BitstreamSizeMode mode) {
    uint64_t multiplier = 0;
    uint64_t fixedSize = type.getBitWidth();
    if (fixedSize > 0)
        return {0, fixedSize};

    if (type.isString())
        return {mode == BitstreamSizeMode::DestEmpty ? 0u : CHAR_BIT, 0u};

    auto handleField = [&](const ValueSymbol& field) {
        auto elemSize = dynamicBitstreamSize(field.getType(), mode);
        if (!elemSize)
            return false;

        // If a dynamically sized field is filled the rest should be empty.
        if (mode == BitstreamSizeMode::DestFill && elemSize.multiplier > 0)
            mode = BitstreamSizeMode::DestEmpty;

        multiplier = std::gcd(multiplier, elemSize.multiplier);
        fixedSize += elemSize.fixed;
        if (fixedSize > Type::MaxBitWidth)
            return false;

        return true;
    };

    if (type.isUnpackedArray()) {
        auto elemSize = dynamicBitstreamSize(*type.getArrayElementType(), mode);
        if (!elemSize)
            return elemSize;

        const auto& ct = type.getCanonicalType();
        if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
            auto rw = ct.as<FixedSizeUnpackedArrayType>().range.width();
            auto mul = checkedMulU64(elemSize.multiplier, rw);
            auto fixed = checkedMulU64(elemSize.fixed, rw);
            if (!mul || !fixed || mul > Type::MaxBitWidth || fixed > Type::MaxBitWidth)
                return {};

            multiplier = *mul;
            fixedSize = *fixed;
        }
        else if (mode == BitstreamSizeMode::DestFill) {
            if (!elemSize.multiplier) {
                multiplier = elemSize.fixed; // element is fixed size
            }
            else {
                multiplier = elemSize.multiplier; // element is dynamically sized
                fixedSize = elemSize.fixed;
            }
        }
        else if (mode == BitstreamSizeMode::Source) {
            multiplier = std::gcd(elemSize.multiplier, elemSize.fixed);
        }
    }
    else if (type.isUnpackedStruct()) {
        auto& us = type.getCanonicalType().as<UnpackedStructType>();
        for (auto field : us.fields) {
            if (!handleField(*field))
                return {};
        }
    }
    else if (type.isClass()) {
        auto& ct = type.getCanonicalType().as<ClassType>();
        SLANG_ASSERT(!ct.hasCycles());
        for (auto& prop : ct.membersOfType<ClassPropertySymbol>()) {
            if (!handleField(prop))
                return {};
        }
    }

    return {multiplier, fixedSize};
}